

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O1

wchar_t lzh_br_fillup(lzh_stream *strm,lzh_br *br)

{
  long lVar1;
  uint64_t uVar2;
  byte *pbVar3;
  ulong *puVar4;
  ulong uVar5;
  int iVar6;
  
  iVar6 = 0x40 - br->cache_avail;
  do {
    switch(iVar6 >> 3) {
    case 0:
      return L'\x01';
    case 6:
      lVar1 = strm->avail_in;
      if (5 < lVar1) {
        pbVar3 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar3[5] |
             (ulong)pbVar3[4] << 8 |
             (ulong)pbVar3[3] << 0x10 |
             (ulong)pbVar3[2] << 0x18 |
             (ulong)pbVar3[1] << 0x20 | (ulong)*pbVar3 << 0x28 | br->cache_buffer << 0x30;
        strm->next_in = pbVar3 + 6;
        strm->avail_in = lVar1 + -6;
        iVar6 = 0x30;
LAB_00157682:
        br->cache_avail = br->cache_avail + iVar6;
        return L'\x01';
      }
      break;
    case 7:
      lVar1 = strm->avail_in;
      if (6 < lVar1) {
        pbVar3 = strm->next_in;
        br->cache_buffer =
             (ulong)pbVar3[6] |
             (ulong)pbVar3[5] << 8 |
             (ulong)pbVar3[4] << 0x10 |
             (ulong)pbVar3[3] << 0x18 |
             (ulong)pbVar3[2] << 0x20 |
             (ulong)pbVar3[1] << 0x28 | (ulong)*pbVar3 << 0x30 | br->cache_buffer << 0x38;
        strm->next_in = pbVar3 + 7;
        strm->avail_in = lVar1 + -7;
        iVar6 = 0x38;
        goto LAB_00157682;
      }
      break;
    case 8:
      lVar1 = strm->avail_in;
      if (7 < lVar1) {
        puVar4 = (ulong *)strm->next_in;
        uVar5 = *puVar4;
        br->cache_buffer =
             uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
             (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
             (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
        strm->next_in = (uchar *)(puVar4 + 1);
        strm->avail_in = lVar1 + -8;
        iVar6 = 0x40;
        goto LAB_00157682;
      }
    }
    lVar1 = strm->avail_in;
    if (lVar1 == 0) {
      return L'\0';
    }
    uVar2 = br->cache_buffer;
    pbVar3 = strm->next_in;
    strm->next_in = pbVar3 + 1;
    br->cache_buffer = (ulong)*pbVar3 | uVar2 << 8;
    strm->avail_in = lVar1 + -1;
    br->cache_avail = br->cache_avail + L'\b';
    iVar6 = iVar6 + -8;
  } while( true );
}

Assistant:

static int
lzh_br_fillup(struct lzh_stream *strm, struct lzh_br *br)
{
	int n = CACHE_BITS - br->cache_avail;

	for (;;) {
		switch (n >> 3) {
		case 8:
			if (strm->avail_in >= 8) {
				br->cache_buffer =
				    ((uint64_t)strm->next_in[0]) << 56 |
				    ((uint64_t)strm->next_in[1]) << 48 |
				    ((uint64_t)strm->next_in[2]) << 40 |
				    ((uint64_t)strm->next_in[3]) << 32 |
				    ((uint32_t)strm->next_in[4]) << 24 |
				    ((uint32_t)strm->next_in[5]) << 16 |
				    ((uint32_t)strm->next_in[6]) << 8 |
				     (uint32_t)strm->next_in[7];
				strm->next_in += 8;
				strm->avail_in -= 8;
				br->cache_avail += 8 * 8;
				return (1);
			}
			break;
		case 7:
			if (strm->avail_in >= 7) {
				br->cache_buffer =
		 		   (br->cache_buffer << 56) |
				    ((uint64_t)strm->next_in[0]) << 48 |
				    ((uint64_t)strm->next_in[1]) << 40 |
				    ((uint64_t)strm->next_in[2]) << 32 |
				    ((uint32_t)strm->next_in[3]) << 24 |
				    ((uint32_t)strm->next_in[4]) << 16 |
				    ((uint32_t)strm->next_in[5]) << 8 |
				     (uint32_t)strm->next_in[6];
				strm->next_in += 7;
				strm->avail_in -= 7;
				br->cache_avail += 7 * 8;
				return (1);
			}
			break;
		case 6:
			if (strm->avail_in >= 6) {
				br->cache_buffer =
		 		   (br->cache_buffer << 48) |
				    ((uint64_t)strm->next_in[0]) << 40 |
				    ((uint64_t)strm->next_in[1]) << 32 |
				    ((uint32_t)strm->next_in[2]) << 24 |
				    ((uint32_t)strm->next_in[3]) << 16 |
				    ((uint32_t)strm->next_in[4]) << 8 |
				     (uint32_t)strm->next_in[5];
				strm->next_in += 6;
				strm->avail_in -= 6;
				br->cache_avail += 6 * 8;
				return (1);
			}
			break;
		case 0:
			/* We have enough compressed data in
			 * the cache buffer.*/ 
			return (1);
		default:
			break;
		}
		if (strm->avail_in == 0) {
			/* There is not enough compressed data to fill up the
			 * cache buffer. */
			return (0);
		}
		br->cache_buffer =
		   (br->cache_buffer << 8) | *strm->next_in++;
		strm->avail_in--;
		br->cache_avail += 8;
		n -= 8;
	}
}